

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataManSerializer.cpp
# Opt level: O2

void __thiscall
adios2::format::DataManSerializer::Log
          (DataManSerializer *this,int level,string *message,bool mpi,bool endline)

{
  int iVar1;
  ostream *poVar2;
  undefined8 uVar3;
  ScopedTimer __var2583;
  Comm local_60;
  ScopedTimer local_58;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  if (Log(int,std::__cxx11::string_const&,bool,bool)::__var583 == '\0') {
    iVar1 = __cxa_guard_acquire(&Log(int,std::__cxx11::string_const&,bool,bool)::__var583);
    if (iVar1 != 0) {
      uVar3 = ps_make_timer_name_("/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/source/adios2/toolkit/format/dataman/DataManSerializer.cpp"
                                  ,
                                  "void adios2::format::DataManSerializer::Log(const int, const std::string &, const bool, const bool)"
                                  ,0x247);
      Log::__var583 = (void *)ps_timer_create_(uVar3);
      __cxa_guard_release(&Log(int,std::__cxx11::string_const&,bool,bool)::__var583);
    }
  }
  external::perfstubs_profiler::ScopedTimer::ScopedTimer(&local_58,Log::__var583);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  helper::Comm::World(&local_60,(string *)this->m_Comm);
  iVar1 = helper::Comm::Rank(&local_60);
  helper::Comm::~Comm(&local_60);
  std::__cxx11::string::~string((string *)&local_50);
  if (level <= this->m_Verbosity) {
    if (mpi) {
      poVar2 = std::operator<<((ostream *)&std::cout,"[Rank ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,iVar1);
      std::operator<<(poVar2,"] ");
    }
    std::operator<<((ostream *)&std::cout,(string *)message);
    if (endline) {
      std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    }
  }
  external::perfstubs_profiler::ScopedTimer::~ScopedTimer(&local_58);
  return;
}

Assistant:

void DataManSerializer::Log(const int level, const std::string &message, const bool mpi,
                            const bool endline)
{
    PERFSTUBS_SCOPED_TIMER_FUNC();
    const int rank = m_Comm.World().Rank();

    if (m_Verbosity >= level)
    {
        if (mpi)
        {
            std::cout << "[Rank " << rank << "] ";
        }
        std::cout << message;
        if (endline)
        {
            std::cout << std::endl;
        }
    }
}